

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

MQTTErrors
mqtt_connect(mqtt_client *client,char *client_id,char *will_topic,void *will_message,
            size_t will_message_size,char *user_name,char *password,uint8_t connect_flags,
            uint16_t keep_alive)

{
  mqtt_queued_message *pmVar1;
  mqtt_queued_message *msg;
  ssize_t rv;
  char *user_name_local;
  size_t will_message_size_local;
  void *will_message_local;
  char *will_topic_local;
  char *client_id_local;
  mqtt_client *client_local;
  
  client->keep_alive = keep_alive;
  if (client->error == MQTT_ERROR_CONNECT_NOT_CALLED) {
    client->error = MQTT_OK;
  }
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    client_local._4_4_ = client->error;
  }
  else {
    msg = (mqtt_queued_message *)
          mqtt_pack_connection_request
                    ((client->mq).curr,(client->mq).curr_sz,client_id,will_topic,will_message,
                     will_message_size,user_name,password,connect_flags,keep_alive);
    if ((long)msg < 0) {
      client_local._4_4_ = (MQTTErrors)msg;
      client->error = client_local._4_4_;
      pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    }
    else {
      if (msg == (mqtt_queued_message *)0x0) {
        mqtt_mq_clean(&client->mq);
        msg = (mqtt_queued_message *)
              mqtt_pack_connection_request
                        ((client->mq).curr,(client->mq).curr_sz,client_id,will_topic,will_message,
                         will_message_size,user_name,password,connect_flags,keep_alive);
        if ((long)msg < 0) {
          client->error = (MQTTErrors)msg;
          pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
          return (MQTTErrors)msg;
        }
        if (msg == (mqtt_queued_message *)0x0) {
          client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
          pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
          return MQTT_ERROR_SEND_BUFFER_IS_FULL;
        }
      }
      pmVar1 = mqtt_mq_register(&client->mq,(size_t)msg);
      pmVar1->control_type = MQTT_CONTROL_CONNECT;
      pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
      client_local._4_4_ = MQTT_OK;
    }
  }
  return client_local._4_4_;
}

Assistant:

enum MQTTErrors mqtt_connect(struct mqtt_client *client,
                     const char* client_id,
                     const char* will_topic,
                     const void* will_message,
                     size_t will_message_size,
                     const char* user_name,
                     const char* password,
                     uint8_t connect_flags,
                     uint16_t keep_alive)
{
    ssize_t rv;
    struct mqtt_queued_message *msg;

    /* Note: Current thread already has mutex locked. */

    /* update the client's state */
    client->keep_alive = keep_alive;
    if (client->error == MQTT_ERROR_CONNECT_NOT_CALLED) {
        client->error = MQTT_OK;
    }
    
    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(rv, msg, client, 
        mqtt_pack_connection_request(
            client->mq.curr, client->mq.curr_sz,
            client_id, will_topic, will_message, 
            will_message_size,user_name, password, 
            connect_flags, keep_alive
        ), 
        1
    );
    /* save the control type of the message */
    msg->control_type = MQTT_CONTROL_CONNECT;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}